

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.hpp
# Opt level: O3

void __thiscall Gmres::gmres(Gmres *this,double *x,double *b_vec)

{
  uint16_t uVar1;
  ushort uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  int16_t i_2;
  uint uVar14;
  ulong uVar15;
  int16_t i_1;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ushort uVar20;
  int iVar21;
  double ret;
  double dVar22;
  double dVar23;
  double dVar24;
  
  (**this->_vptr_Gmres)(this,this->v_mat,x);
  lVar7 = (long)(short)this->len;
  dVar22 = 0.0;
  if (0 < lVar7) {
    pdVar3 = this->v_mat;
    lVar8 = 0;
    do {
      pdVar3[lVar8] = b_vec[lVar8] - pdVar3[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
    dVar22 = 0.0;
    lVar8 = 0;
    do {
      dVar22 = dVar22 + pdVar3[lVar8] * pdVar3[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if (dVar22 < 0.0) {
    dVar22 = sqrt(dVar22);
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  *this->rho_e_vec = dVar22;
  if (dVar22 < this->tol) {
    return;
  }
  uVar1 = this->len;
  if (0 < (long)(short)uVar1) {
    pdVar3 = this->v_mat;
    lVar7 = 0;
    do {
      pdVar3[lVar7] = pdVar3[lVar7] * (1.0 / dVar22);
      lVar7 = lVar7 + 1;
    } while ((short)uVar1 != lVar7);
  }
  if (this->k_max != 0) {
    lVar7 = 1;
    uVar19 = 0;
    uVar9 = 0;
LAB_0010446b:
    iVar21 = (int)uVar9;
    uVar10 = uVar9 + 1;
    (**this->_vptr_Gmres)(this,this->v_mat + uVar10 * this->len,this->v_mat + this->len * uVar9);
    uVar2 = this->len;
    uVar12 = (ulong)uVar2;
    uVar20 = this->k_max;
    pdVar3 = this->v_mat;
    pdVar4 = this->h_mat;
    pdVar5 = this->U_buf;
    iVar18 = (int)lVar7;
    uVar11 = (uint)uVar2 * iVar18 & 0xffff;
    lVar8 = 0;
LAB_001044c9:
    do {
      uVar16 = (uVar20 + 1) * iVar21 + (int)lVar8 & 0xffff;
      if ((short)uVar2 < 1) goto LAB_00104550;
      uVar14 = (uint)uVar2 * (int)lVar8 & 0xffff;
      dVar22 = 0.0;
      uVar17 = 0;
      do {
        dVar22 = dVar22 + pdVar3[uVar14 + uVar17] * pdVar3[uVar11 + uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar12 != uVar17);
      pdVar4[uVar16] = dVar22;
      uVar17 = 0;
      do {
        pdVar5[uVar17] = pdVar3[uVar14 + uVar17] * dVar22;
        uVar17 = uVar17 + 1;
      } while (uVar12 != uVar17);
      uVar17 = 0;
      do {
        pdVar3[uVar11 + uVar17] = pdVar3[uVar11 + uVar17] - pdVar5[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar12 != uVar17);
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
    if (0 < (short)uVar2) {
      dVar22 = 0.0;
      uVar17 = 0;
      do {
        dVar22 = dVar22 + pdVar3[(iVar18 * (uint)uVar2 & 0xffff) + uVar17] *
                          pdVar3[(iVar18 * (uint)uVar2 & 0xffff) + uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar12 != uVar17);
      goto LAB_00104599;
    }
    goto LAB_00104595;
  }
  uVar20 = 0;
  uVar12 = 0;
LAB_001048b5:
  pdVar4 = this->v_mat;
  pdVar5 = this->rho_e_vec;
  uVar2 = this->len;
  uVar9 = (ulong)uVar2;
  pdVar3 = pdVar4 + uVar12 * uVar9;
  if (pdVar3 != pdVar5) {
    if (0 < (short)uVar2) {
      memset(pdVar3,0,(ulong)((uint)uVar2 * 8));
    }
    if (0 < (short)uVar20) {
      lVar7 = 0;
      uVar19 = 0;
      do {
        if (0 < (short)uVar2) {
          uVar10 = 0;
          do {
            pdVar3[uVar10] =
                 pdVar4[(short)((short)lVar7 + (short)uVar10)] * pdVar5[uVar19] + pdVar3[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        uVar19 = uVar19 + 1;
        lVar7 = lVar7 + uVar9;
      } while (uVar19 != uVar20);
    }
    if (0 < (short)uVar2) {
      uVar19 = 0;
      do {
        x[uVar19] = x[uVar19] + pdVar3[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar9 != uVar19);
    }
    return;
  }
  printf("%s pointer error !\n","mul");
  exit(-1);
LAB_00104550:
  pdVar4[uVar16] = 0.0;
  lVar8 = lVar8 + 1;
  if (lVar8 == lVar7) goto LAB_00104595;
  goto LAB_001044c9;
LAB_00104595:
  dVar22 = 0.0;
LAB_00104599:
  if (dVar22 < 0.0) {
    dVar22 = sqrt(dVar22);
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  pdVar3 = this->h_mat;
  pdVar3[((ulong)uVar20 + 1) * uVar9 + uVar10 & 0xffff] = dVar22;
  if (ABS(dVar22) < 2.220446049250313e-16) {
    puts("Breakdown");
    return;
  }
  uVar1 = this->len;
  if (0 < (long)(short)uVar1) {
    pdVar4 = this->v_mat;
    uVar11 = iVar18 * (uint)uVar2 & 0xffff;
    lVar8 = 0;
    do {
      pdVar4[(ulong)uVar11 + lVar8] = pdVar4[(ulong)uVar11 + lVar8] * (1.0 / dVar22);
      lVar8 = lVar8 + 1;
    } while ((short)uVar1 != lVar8);
  }
  uVar2 = this->k_max;
  if (uVar9 != 0) {
    pdVar4 = this->g_vec;
    uVar11 = (uVar2 + 1) * iVar21;
    uVar12 = 0;
    do {
      uVar17 = uVar12 & 0xffff;
      uVar15 = (ulong)(uVar11 & 0xffff);
      dVar22 = -(pdVar4[uVar17] * pdVar3[uVar15] + pdVar4[uVar17 + 1] * pdVar3[uVar15 + 1]) *
               pdVar4[uVar17 + 2];
      pdVar3[uVar15] = pdVar4[uVar17] * dVar22 + pdVar3[uVar15];
      pdVar3[uVar15 + 1] = dVar22 * pdVar4[uVar17 + 1] + pdVar3[uVar15 + 1];
      uVar12 = uVar12 + 3;
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar12);
  }
  uVar12 = (ulong)(iVar21 * (uVar2 + 2) & 0xffff);
  dVar22 = pdVar3[uVar12];
  dVar23 = pdVar3[uVar12 + 1] * pdVar3[uVar12 + 1] + dVar22 * dVar22 + 0.0;
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  dVar24 = (double)(-(ulong)(dVar22 < 0.0) & (ulong)dVar23 |
                   ~-(ulong)(dVar22 < 0.0) & (ulong)-dVar23);
  pdVar3 = this->h_mat;
  pdVar4 = this->g_vec;
  dVar23 = pdVar3[uVar12] - dVar24;
  uVar17 = (ulong)(ushort)((short)uVar9 * 3);
  pdVar4[uVar17] = dVar23;
  dVar22 = pdVar3[uVar12 + 1];
  pdVar4[uVar17 + 1] = dVar22;
  pdVar4[uVar17 + 2] = 2.0 / (dVar22 * dVar22 + dVar23 * dVar23 + 0.0);
  pdVar3[uVar12] = dVar24;
  pdVar3[uVar12 + 1] = 0.0;
  pdVar3 = this->rho_e_vec;
  dVar22 = -pdVar4[uVar17] * pdVar3[uVar9] * pdVar4[uVar17 + 2];
  pdVar3[uVar9] = pdVar4[uVar17] * dVar22 + pdVar3[uVar9];
  dVar22 = dVar22 * pdVar4[uVar17 + 1];
  pdVar3[uVar10] = dVar22;
  uVar2 = this->k_max;
  uVar12 = (ulong)uVar2;
  if (ABS(dVar22) < this->tol) goto LAB_001047f8;
  lVar7 = lVar7 + 1;
  uVar19 = uVar19 + 3;
  uVar9 = uVar10;
  if (uVar2 <= uVar10) goto code_r0x001047f5;
  goto LAB_0010446b;
code_r0x001047f5:
  iVar21 = iVar21 + 1;
LAB_001047f8:
  uVar20 = (ushort)iVar21;
  uVar13 = uVar20 - 1;
  if (-1 < (short)uVar13) {
    pdVar3 = this->h_mat;
    pdVar4 = this->rho_e_vec;
    uVar11 = iVar21 + (uVar2 + 1) * (uint)uVar13;
    uVar9 = (ulong)uVar13;
    do {
      uVar11 = uVar11 - 1;
      dVar22 = pdVar4[uVar9];
      uVar16 = uVar11;
      for (uVar19 = (ulong)uVar13; (long)uVar9 < (long)uVar19; uVar19 = uVar19 - 1) {
        uVar10 = (ulong)uVar16;
        uVar16 = uVar16 + ~(uint)uVar2;
        dVar22 = dVar22 - pdVar3[uVar10 & 0xffff] * pdVar4[uVar19];
        pdVar4[uVar9] = dVar22;
      }
      pdVar4[uVar9] = dVar22 / pdVar3[(uVar2 + 2) * (int)uVar9 & 0xffff];
      bVar6 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar6);
  }
  goto LAB_001048b5;
}

Assistant:

void gmres(double *x, const double *b_vec) {
    uint16_t k, idx_v1, idx_v2, idx_h, idx_g;
    double buf;

    // r0 = b - Ax(x0)
    Ax_func(&v_mat[0], x);
    sub(&v_mat[0], b_vec, &v_mat[0], len);

    // rho = sqrt(r0' * r0)
    rho_e_vec[0] = norm(&v_mat[0], len);

    if (rho_e_vec[0] < tol) {
      return;
    }

    // v(0) = r0 / rho
    div(&v_mat[0], &v_mat[0], rho_e_vec[0], len);

    for (k = 0; k < k_max; k++) {
      // v(k + 1) = Ax(v(k))
      Ax_func(&v_mat[len * (k + 1)], &v_mat[len * k]);

      idx_v1 = len * (k + 1);
      // Modified Gram-Schmidt
      for (uint16_t i = 0; i < k + 1; i++) {
        idx_v2 = len * i;
        idx_h = (k_max + 1) * k + i;
        h_mat[idx_h] = dot(&v_mat[idx_v2], &v_mat[idx_v1], len);
        mul(U_buf, &v_mat[idx_v2], h_mat[idx_h], len);
        sub(&v_mat[idx_v1], &v_mat[idx_v1], U_buf, len);
      }
      idx_h = (k_max + 1) * k + (k + 1);
      h_mat[idx_h] = norm(&v_mat[idx_v1], len);

      // Check breakdown
      if (fabs(h_mat[idx_h]) < DBL_EPSILON) {
        printf("Breakdown\n");
        return;
      } else {
        div(&v_mat[idx_v1], &v_mat[idx_v1], h_mat[idx_h], len);
      }

      // Transformation h_mat to upper triangular matrix by Householder transformation
      for (uint16_t i = 0; i < k; i++) {
        idx_h = (k_max + 1) * k + i;
        idx_g = g_vec_len * i;
        buf = (g_vec[idx_g + 0] * h_mat[idx_h + 0] + g_vec[idx_g + 1] * h_mat[idx_h + 1]) * g_vec[idx_g + 2];
        h_mat[idx_h + 0] = h_mat[idx_h + 0] - buf * g_vec[idx_g + 0];
        h_mat[idx_h + 1] = h_mat[idx_h + 1] - buf * g_vec[idx_g + 1];
      }
      idx_h = (k_max + 1) * k + k;
      idx_g = g_vec_len * k;
      buf = -sign(h_mat[idx_h]) * norm(&h_mat[idx_h], 2);  // Vector length
      g_vec[idx_g + 0] = h_mat[idx_h + 0] - buf;
      g_vec[idx_g + 1] = h_mat[idx_h + 1];
      g_vec[idx_g + 2] = 2.0 / dot(&g_vec[idx_g], &g_vec[idx_g], 2);
      h_mat[idx_h + 0] = buf;
      h_mat[idx_h + 1] = 0.0;

      // Update residual
      buf = g_vec[idx_g + 0] * rho_e_vec[k + 0] * g_vec[idx_g + 2];
      rho_e_vec[k + 0] = rho_e_vec[k + 0] - buf * g_vec[idx_g + 0];
      rho_e_vec[k + 1] = -buf * g_vec[idx_g + 1];

      // Check convergence
      if (fabs(rho_e_vec[k + 1]) < tol) {
        break;
      }
    }

    // Solve h_mat * y = rho_e_vec
    // h_mat is upper triangle matrix
    for (int16_t i = k - 1; i >= 0; i--) {
      for (int16_t j = k - 1; j > i; j--) {
        idx_h = (k_max + 1) * j + i;
        rho_e_vec[i] -= h_mat[idx_h] * rho_e_vec[j];
      }
      idx_h = (k_max + 1) * i + i;
      rho_e_vec[i] /= h_mat[idx_h];
    }

    // x = x + v_mat * y
    mul(&v_mat[len * k_max], v_mat, rho_e_vec, len, k);
    add(x, x, &v_mat[len * k_max], len);
  }